

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

bool __thiscall HighsSymmetryDetection::partitionRefinement(HighsSymmetryDetection *this)

{
  HighsHashTable<int,_unsigned_int> *this_00;
  ulong uVar1;
  int cell;
  ValueType VVar2;
  pointer puVar3;
  int *piVar4;
  pointer piVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  ValueType *pVVar9;
  int *piVar10;
  ulong uVar11;
  int splitPoint;
  pointer piVar12;
  long lVar13;
  int iVar14;
  HighsInt *pHVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  ulong uVar16;
  ValueType VVar17;
  HighsInt HVar18;
  HighsInt *pHVar19;
  HighsInt *pHVar20;
  long lVar21;
  pointer piVar22;
  HighsInt vertex;
  ulong local_58;
  pointer local_50;
  pointer local_48;
  long local_40;
  anon_class_8_1_8991fb9c local_38;
  
  this_00 = &this->vertexHash;
LAB_002f63d9:
  do {
    piVar12 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar22 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (piVar12 == piVar22) goto LAB_002f668b;
    local_50 = piVar22;
    local_48 = piVar12;
    std::
    pop_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
              (piVar12,piVar22);
    puVar3 = (this->cellInRefinementQueue).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar12 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    cell = piVar12[-1];
    (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar12 + -1;
    uVar11 = (ulong)cell;
    puVar3[uVar11] = '\0';
    iVar14 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
  } while (iVar14 - cell == 1);
  local_40 = (long)iVar14;
  piVar12 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pHVar19 = piVar12 + local_40;
  local_38.this = this;
  for (pHVar15 = piVar12 + uVar11; pHVar20 = pHVar19, pHVar15 != pHVar19; pHVar15 = pHVar15 + 1) {
    bVar7 = partitionRefinement::anon_class_8_1_8991fb9c::operator()(&local_38,*pHVar15);
    if (!bVar7) {
      do {
        pHVar19 = pHVar19 + -1;
        pHVar20 = pHVar15;
        if (pHVar19 == pHVar15) goto LAB_002f64af;
        bVar7 = partitionRefinement::anon_class_8_1_8991fb9c::operator()(&local_38,*pHVar19);
      } while (!bVar7);
      HVar18 = *pHVar15;
      *pHVar15 = *pHVar19;
      *pHVar19 = HVar18;
    }
  }
LAB_002f64af:
  piVar12 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = (ulong)((long)pHVar20 - (long)piVar12) >> 2;
  if (iVar14 == (int)local_58) goto LAB_002f63d9;
  lVar21 = ((long)pHVar20 - (long)piVar12) * 0x40000000 >> 0x1e;
  lVar13 = local_40 * 4 - lVar21;
  if (lVar13 != 0) {
    end._M_current = piVar12 + local_40;
    iVar8 = pdqsort_detail::log2<long>(lVar13 >> 2);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::partitionRefinement()::__1,false>
              ((int *)(lVar21 + (long)piVar12),end,(anon_class_8_1_8991fb9c)this,iVar8,true);
  }
  splitPoint = (int)local_58;
  uVar16 = uVar11;
  iVar8 = cell;
  if (cell != splitPoint) {
    bVar7 = splitCell(this,cell,splitPoint);
    if (!bVar7) {
      piVar4 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar10 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar10 != piVar4; piVar10 = piVar10 + 1) {
        (this->cellInRefinementQueue).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[*piVar10] = '\0';
      }
      piVar5 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar12 = local_48;
      piVar22 = local_50;
      if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar5) {
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar5;
      }
LAB_002f668b:
      HighsHashTable<int,_unsigned_int>::clear(this_00);
LAB_002f6695:
      return piVar12 == piVar22;
    }
    updateCellMembership(this,splitPoint,splitPoint,true);
    uVar16 = (ulong)splitPoint;
    iVar8 = splitPoint;
  }
  pVVar9 = HighsHashTable<int,_unsigned_int>::operator[]
                     (this_00,(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar16);
  VVar17 = *pVVar9;
  while (uVar1 = uVar16 + 1, (long)uVar1 < local_40) {
    vertex = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16 + 1];
    pVVar9 = HighsHashTable<int,_unsigned_int>::operator[](this_00,&vertex);
    VVar2 = *pVVar9;
    HVar18 = (HighsInt)uVar1;
    if ((VVar17 != VVar2) &&
       (bVar7 = splitCell(this,iVar8,HVar18), piVar12 = local_48, piVar22 = local_50,
       uVar6 = local_58, iVar8 = HVar18, VVar17 = VVar2, !bVar7)) {
      piVar4 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar10 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar10 != piVar4; piVar10 = piVar10 + 1) {
        (this->cellInRefinementQueue).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[*piVar10] = '\0';
      }
      piVar5 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar5) {
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar5;
      }
      HighsHashTable<int,_unsigned_int>::clear(this_00);
      (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar11] = iVar14;
      while (iVar14 = (int)uVar16, (int)uVar6 <= iVar14) {
        updateCellMembership(this,iVar14,cell,false);
        uVar16 = (ulong)(iVar14 - 1);
      }
      goto LAB_002f6695;
    }
    updateCellMembership(this,HVar18,iVar8,true);
    uVar16 = uVar1;
  }
  goto LAB_002f63d9;
}

Assistant:

bool HighsSymmetryDetection::partitionRefinement() {
  while (!refinementQueue.empty()) {
    std::pop_heap(refinementQueue.begin(), refinementQueue.end(),
                  std::greater<HighsInt>());

    HighsInt cellStart = refinementQueue.back();
    HighsInt firstCellStart = cellStart;
    refinementQueue.pop_back();
    cellInRefinementQueue[cellStart] = false;

    if (cellSize(cellStart) == 1) continue;
    HighsInt cellEnd = currentPartitionLinks[cellStart];
    assert(cellEnd >= cellStart);

    // first check which vertices do have updated hash values and put them to
    // the end of the partition
    HighsInt refineStart =
        std::partition(
            currentPartition.begin() + cellStart,
            currentPartition.begin() + cellEnd,
            [&](HighsInt v) { return vertexHash.find(v) == nullptr; }) -
        currentPartition.begin();

    // if there are none there is nothing to refine
    if (refineStart == cellEnd) continue;

    // sort the vertices that have updated hash values by their hash values
    pdqsort(currentPartition.begin() + refineStart,
            currentPartition.begin() + cellEnd, [&](HighsInt v1, HighsInt v2) {
              return vertexHash[v1] < vertexHash[v2];
            });

    // if not all vertices have updated hash values directly create the first
    // new cell at the start of the range that we want to refine
    if (refineStart != cellStart) {
      assert(refineStart != cellStart);
      assert(refineStart != cellEnd);
      if (!splitCell(cellStart, refineStart)) {
        // node can be pruned, make sure hash values are cleared and queue is
        // empty
        for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
        refinementQueue.clear();
        vertexHash.clear();
        return false;
      }
      cellStart = refineStart;
      updateCellMembership(cellStart, cellStart);
    }

    // now update the remaining vertices
    bool prune = false;
    HighsInt i;
    assert(vertexHash.find(currentPartition[cellStart]) != nullptr);
    // store value of first hash
    u64 lastHash = vertexHash[currentPartition[cellStart]];
    for (i = cellStart + 1; i < cellEnd; ++i) {
      HighsInt vertex = currentPartition[i];
      // get this vertex hash value
      u64 hash = vertexHash[vertex];

      if (hash != lastHash) {
        // hash values do not match -> start of new cell
        if (!splitCell(cellStart, i)) {
          // refinement process yielded bad prefix of certificate
          // -> node can be pruned
          prune = true;
          break;
        }
        cellStart = i;
        // remember hash value of this new cell under lastHash
        lastHash = hash;
      }

      // update membership of vertex to new cell
      updateCellMembership(i, cellStart);
    }

    if (prune) {
      // node can be pruned, make sure hash values are cleared and queue is
      // empty
      for (HighsInt c : refinementQueue) cellInRefinementQueue[c] = false;
      refinementQueue.clear();
      vertexHash.clear();
      currentPartitionLinks[firstCellStart] = cellEnd;

      // undo possibly incomplete changes done to the cells
      for (--i; i >= refineStart; --i)
        updateCellMembership(i, firstCellStart, false);

      return false;
    }

    assert(currentPartitionLinks[cellStart] == cellEnd);
  }

  vertexHash.clear();

  return true;
}